

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void rekey_test(void)

{
  fdb_encryption_key new_key_00;
  FILE *pFVar1;
  fdb_status fVar2;
  int iVar3;
  char *pcVar4;
  fdb_status s_6;
  fdb_status s_5;
  fdb_status s_4;
  fdb_status s_3;
  fdb_status s_2;
  fdb_encryption_key new_key;
  fdb_status s_1;
  fdb_status s;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char temp [256];
  char bodybuf [256];
  char keybuf [256];
  fdb_status status;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  void *value;
  size_t valuelen;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle **in_stack_fffffffffffffa38;
  fdb_kvs_handle *handle;
  fdb_file_handle *in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa5c;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffa64;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa6c;
  void *in_stack_fffffffffffffa70;
  fdb_kvs_handle *key;
  fdb_kvs_handle *in_stack_fffffffffffffa78;
  fdb_kvs_handle *handle_00;
  fdb_kvs_handle *local_4e8;
  fdb_file_handle *pfStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined4 local_4c8;
  undefined4 local_4c4;
  char acStack_4c0 [32];
  fdb_status local_4a0;
  fdb_status local_49c;
  undefined8 local_470;
  undefined4 local_464;
  undefined4 local_45c;
  undefined1 local_451;
  undefined4 local_3f0;
  undefined1 auStack_3ec [68];
  fdb_config *in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffc60;
  fdb_file_handle **in_stack_fffffffffffffc68;
  char local_388 [256];
  char local_288 [256];
  undefined1 local_188 [280];
  void *local_70;
  size_t local_68;
  int local_5c;
  int local_58;
  uint local_54;
  void *local_30;
  __int_type local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = (void *)local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_5c = 10;
  local_58 = system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_470 = 0x400;
  local_45c = 1;
  local_464 = 0;
  local_451 = 0;
  local_3f0 = 0xffffffff;
  memset(auStack_3ec,0x42,0x20);
  fdb_open(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  fdb_kvs_open_default
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,(fdb_kvs_config *)0x11ca65);
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_188._264_8_,logCallbackFunc,"api_wrapper_test");
  pFVar1 = _stderr;
  local_49c = fVar2;
  local_188._260_4_ = fVar2;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x116a);
    rekey_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x116a,"void rekey_test()");
  }
  local_188._260_4_ =
       fdb_set_kv(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                  CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                  (void *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                  CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
  if (local_188._260_4_ != FDB_RESULT_INVALID_ARGS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x116e);
    rekey_test::__test_pass = 0;
    if (local_188._260_4_ != FDB_RESULT_INVALID_ARGS) {
      __assert_fail("status == FDB_RESULT_INVALID_ARGS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x116e,"void rekey_test()");
    }
  }
  for (local_54 = 0; (int)local_54 < local_5c; local_54 = local_54 + 1) {
    sprintf(local_188,"key%d",(ulong)local_54);
    sprintf(local_288,"body%d",(ulong)local_54);
    strlen(local_188);
    strlen(local_288);
    fVar2 = fdb_set_kv(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                       CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),
                       (void *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                       CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    pFVar1 = _stderr;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      local_4a0 = fVar2;
      local_188._260_4_ = fVar2;
      pcVar4 = fdb_error_msg(fVar2);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x1175);
      rekey_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x1175,"void rekey_test()");
    }
    local_4a0 = 0;
    local_188._260_4_ = FDB_RESULT_SUCCESS;
  }
  local_4c4 = 0xffffffff;
  memset(acStack_4c0,0xbd,0x20);
  strcpy(acStack_4c0,"bar");
  memcpy(&local_4e8,&local_4c4,0x24);
  new_key_00.bytes[4] = (undefined1)local_4d8;
  new_key_00.bytes[5] = local_4d8._1_1_;
  new_key_00.bytes[6] = local_4d8._2_1_;
  new_key_00.bytes[7] = local_4d8._3_1_;
  new_key_00.bytes[8] = local_4d8._4_1_;
  new_key_00.bytes[9] = local_4d8._5_1_;
  new_key_00.bytes[10] = local_4d8._6_1_;
  new_key_00.bytes[0xb] = local_4d8._7_1_;
  new_key_00._0_8_ = pfStack_4e0;
  new_key_00.bytes[0xc] = (undefined1)uStack_4d0;
  new_key_00.bytes[0xd] = uStack_4d0._1_1_;
  new_key_00.bytes[0xe] = uStack_4d0._2_1_;
  new_key_00.bytes[0xf] = uStack_4d0._3_1_;
  new_key_00.bytes[0x10] = uStack_4d0._4_1_;
  new_key_00.bytes[0x11] = uStack_4d0._5_1_;
  new_key_00.bytes[0x12] = uStack_4d0._6_1_;
  new_key_00.bytes[0x13] = uStack_4d0._7_1_;
  new_key_00.bytes[0x14] = (undefined1)local_4c8;
  new_key_00.bytes[0x15] = local_4c8._1_1_;
  new_key_00.bytes[0x16] = local_4c8._2_1_;
  new_key_00.bytes[0x17] = local_4c8._3_1_;
  new_key_00.bytes[0x18] = (char)in_stack_fffffffffffffa5c;
  new_key_00.bytes[0x19] = (char)((uint)in_stack_fffffffffffffa5c >> 8);
  new_key_00.bytes[0x1a] = (char)((uint)in_stack_fffffffffffffa5c >> 0x10);
  new_key_00.bytes[0x1b] = (char)((uint)in_stack_fffffffffffffa5c >> 0x18);
  new_key_00.bytes[0x1c] = (char)in_stack_fffffffffffffa60;
  new_key_00.bytes[0x1d] = (char)((uint)in_stack_fffffffffffffa60 >> 8);
  new_key_00.bytes[0x1e] = (char)((uint)in_stack_fffffffffffffa60 >> 0x10);
  new_key_00.bytes[0x1f] = (char)((uint)in_stack_fffffffffffffa60 >> 0x18);
  fVar2 = fdb_rekey((fdb_file_handle *)0x11cdd5,new_key_00);
  pFVar1 = _stderr;
  local_188._260_4_ = fVar2;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x117f);
    rekey_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x117f,"void rekey_test()");
  }
  fdb_kvs_close(local_4e8);
  fdb_close((fdb_file_handle *)local_4e8);
  memcpy(&local_3f0,&local_4c4,0x24);
  fVar2 = fdb_open(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  pFVar1 = _stderr;
  local_188._260_4_ = fVar2;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x1188);
    rekey_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x1188,"void rekey_test()");
  }
  fVar2 = fdb_kvs_open_default(pfStack_4e0,(fdb_kvs_handle **)local_4e8,(fdb_kvs_config *)0x11cf79);
  pFVar1 = _stderr;
  local_188._260_4_ = fVar2;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_log_callback
                      ((fdb_kvs_handle *)local_188._264_8_,logCallbackFunc,"api_wrapper_test");
    pFVar1 = _stderr;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      local_188._260_4_ = fVar2;
      pcVar4 = fdb_error_msg(fVar2);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x118d);
      rekey_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x118d,"void rekey_test()");
    }
    local_54 = 0;
    local_188._260_4_ = FDB_RESULT_SUCCESS;
    handle = local_4e8;
    uVar5 = local_4c8;
    while( true ) {
      if (local_5c <= (int)local_54) {
        fdb_kvs_close(handle);
        fdb_close((fdb_file_handle *)handle);
        fdb_shutdown();
        memleak_end();
        if (rekey_test::__test_pass == 0) {
          fprintf(_stderr,"%s FAILED\n","encryption rekey test");
        }
        else {
          fprintf(_stderr,"%s PASSED\n","encryption rekey test");
        }
        return;
      }
      sprintf(local_188,"key%d",(ulong)local_54);
      handle_00 = (fdb_kvs_handle *)local_188;
      key = (fdb_kvs_handle *)local_188._264_8_;
      strlen(local_188);
      fVar2 = fdb_get_kv(handle_00,key,CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68)
                         ,(void **)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                         (size_t *)CONCAT44(in_stack_fffffffffffffa5c,uVar5));
      local_188._260_4_ = fVar2;
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      sprintf(local_388,"body%d",(ulong)local_54);
      iVar3 = memcmp(local_70,local_388,local_68);
      if (iVar3 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_388,local_70,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x1197);
        rekey_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x1197,"void rekey_test()");
      }
      fdb_free_block((void *)0x11d282);
      local_54 = local_54 + 1;
    }
    uVar5 = SUB84(_stderr,0);
    uVar6 = (undefined4)((ulong)_stderr >> 0x20);
    pcVar4 = fdb_error_msg(fVar2);
    fprintf((FILE *)CONCAT44(uVar6,uVar5),"Test failed with fdb_status %d (%s) at %s %d\n",
            (ulong)(uint)fVar2,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x1195);
    rekey_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x1195,"void rekey_test()");
  }
  pcVar4 = fdb_error_msg(fVar2);
  fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar4,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0x118a);
  rekey_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x118a,"void rekey_test()");
}

Assistant:

void rekey_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    size_t valuelen;
    void *value;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;

    char keybuf[256], bodybuf[256], temp[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    fconfig.encryption_key.algorithm = -1; // Bogus encryption
    memset(fconfig.encryption_key.bytes, 0x42, sizeof(fconfig.encryption_key.bytes));

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "api_wrapper_test");
    TEST_STATUS(status);

    // error check
    status = fdb_set_kv(db, NULL, 0, NULL, 0);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    // insert key-value pairs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
    }

    // change the encryption key:
    fdb_encryption_key new_key;
    new_key.algorithm = -1; // Bogus encryption
    memset(new_key.bytes, 0xBD, sizeof(new_key.bytes));
    strcpy((char*)new_key.bytes, "bar");

    status = fdb_rekey(dbfile, new_key);
    TEST_STATUS(status);

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen db
    fconfig.encryption_key = new_key;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_STATUS(status);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "api_wrapper_test");
    TEST_STATUS(status);

    // retrieve key-value pairs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value, &valuelen);

        // updated documents
        TEST_STATUS(status);
        sprintf(temp, "body%d", i);
        TEST_CMP(value, temp, valuelen);
        fdb_free_block(value);
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("encryption rekey test");
}